

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2367b4::CAPIBuildEngineDelegate::cycleDetected
          (CAPIBuildEngineDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  pointer ppRVar1;
  pointer ppRVar2;
  vector<llb_data_t_,_std::allocator<llb_data_t_>_> keys;
  llb_data_t_ local_58;
  _Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (llb_data_t *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::reserve
            ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&local_48,
             (long)(items->
                   super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(items->
                   super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppRVar1 = (items->
            super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar2 = (items->
                 super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppRVar2 != ppRVar1; ppRVar2 = ppRVar2 + 1
      ) {
    local_58.length = ((*ppRVar2)->key).key._M_string_length;
    local_58.data = (uint8_t *)((*ppRVar2)->key).key._M_dataplus._M_p;
    std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::emplace_back<llb_data_t_>
              ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&local_48,&local_58);
  }
  (*(this->cAPIDelegate).cycle_detected)
            ((this->cAPIDelegate).context,local_48._M_impl.super__Vector_impl_data._M_start,
             (long)local_48._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48._M_impl.super__Vector_impl_data._M_start >> 4);
  std::_Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    std::vector<llb_data_t> keys;
    keys.reserve(items.size());
    for (auto item : items) {
      const KeyType &key = item->key;
      keys.push_back({ key.size(), (const uint8_t*)key.data() });
    }

    cAPIDelegate.cycle_detected(cAPIDelegate.context, keys.data(), keys.size());
  }